

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_01;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  cpp_dec_float<100U,_int,_void> local_398;
  int *local_348;
  int32_t local_340;
  int local_33c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_330;
  int *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_d8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_d8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_d8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_d8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_d8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_d8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_d8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_d8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_d8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  vSolveLright2(this,rhs,ridx,&rn,&local_88,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_d8);
  local_348 = idx;
  local_338 = vec;
  local_330 = this;
  local_320 = eps;
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    if (rn < 1) {
      uVar16 = 0;
    }
    else {
      piVar4 = (this->row).perm;
      lVar13 = 0;
      uVar12 = 0;
      do {
        uVar16 = (uint)uVar12;
        iVar9 = ridx[lVar13];
        local_398.exp = rhs[iVar9].m_backend.exp;
        local_398.neg = rhs[iVar9].m_backend.neg;
        local_398.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar9].m_backend.data._M_elems;
        local_398.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar9].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar9].m_backend.data._M_elems + 4;
        local_398.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_398.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar9].m_backend.data._M_elems + 8;
        local_398.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_398.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar9].m_backend.data._M_elems + 0xc;
        local_398.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_398.data._M_elems._56_5_ = SUB85(uVar5,0);
        local_398.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_398.fpclass = rhs[iVar9].m_backend.fpclass;
        local_398.prec_elem = rhs[iVar9].m_backend.prec_elem;
        local_2b8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2b8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2b8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2b8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2b8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2b8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_2b8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_2b8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_2b8.exp = (eps->m_backend).exp;
        local_2b8.neg = (eps->m_backend).neg;
        local_2b8.fpclass = (eps->m_backend).fpclass;
        local_2b8.prec_elem = (eps->m_backend).prec_elem;
        if ((local_398.neg == true) &&
           (local_398.data._M_elems[0] != 0 || local_398.fpclass != cpp_dec_float_finite)) {
          local_398.neg = false;
        }
        if ((local_2b8.fpclass == cpp_dec_float_NaN || local_398.fpclass == cpp_dec_float_NaN) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_398,&local_2b8), iVar8 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar9].m_backend,0);
        }
        else {
          iVar9 = piVar4[iVar9];
          uVar11 = uVar16;
          if (0 < (int)uVar16) {
            do {
              uVar14 = (uint)uVar12 - 1;
              uVar10 = uVar14 >> 1;
              uVar11 = (uint)uVar12;
              if (iVar9 <= ridx[uVar10]) break;
              ridx[uVar12] = ridx[uVar10];
              uVar12 = (ulong)uVar10;
              uVar11 = uVar10;
            } while (1 < uVar14);
          }
          uVar12 = (ulong)(uVar16 + 1);
          ridx[(int)uVar11] = iVar9;
        }
        lVar13 = lVar13 + 1;
        uVar16 = (int)uVar12;
      } while (lVar13 < rn);
    }
  }
  else {
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    if (rn < 1) {
      uVar16 = 0;
    }
    else {
      local_328 = (int *)eps2.m_backend.data._M_elems._48_8_;
      piVar4 = (this->row).perm;
      lVar13 = 0;
      uVar16 = 0;
      do {
        iVar9 = ridx[lVar13];
        lVar15 = (long)iVar9;
        lVar17 = lVar15 * 0x50;
        result.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])rhs[lVar15].m_backend.data._M_elems;
        result.m_backend.data._M_elems._16_16_ =
             *(undefined1 (*) [16])(rhs[lVar15].m_backend.data._M_elems + 4);
        result.m_backend.data._M_elems._32_16_ =
             *(undefined1 (*) [16])(rhs[lVar15].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._48_16_ =
             *(undefined1 (*) [16])(rhs[lVar15].m_backend.data._M_elems + 0xc);
        local_398.exp = rhs[lVar15].m_backend.exp;
        bVar2 = rhs[lVar15].m_backend.neg;
        fVar3 = rhs[lVar15].m_backend.fpclass;
        local_398.prec_elem = rhs[lVar15].m_backend.prec_elem;
        local_398.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar15].m_backend.data._M_elems;
        local_398.data._M_elems._8_8_ = *(undefined8 *)(rhs[lVar15].m_backend.data._M_elems + 2);
        puVar1 = rhs[lVar15].m_backend.data._M_elems + 4;
        local_398.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_398.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[lVar15].m_backend.data._M_elems + 8;
        local_398.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_398.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[lVar15].m_backend.data._M_elems + 0xc;
        local_398.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_398.data._M_elems._56_5_ = SUB85(uVar5,0);
        local_398.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_268.data._M_elems._0_8_ = *(undefined8 *)(local_320->m_backend).data._M_elems;
        local_268.data._M_elems._8_8_ = *(undefined8 *)((local_320->m_backend).data._M_elems + 2);
        local_268.data._M_elems._16_8_ = *(undefined8 *)((local_320->m_backend).data._M_elems + 4);
        local_268.data._M_elems._24_8_ = *(undefined8 *)((local_320->m_backend).data._M_elems + 6);
        local_268.data._M_elems._32_8_ = *(undefined8 *)((local_320->m_backend).data._M_elems + 8);
        local_268.data._M_elems._40_8_ = *(undefined8 *)((local_320->m_backend).data._M_elems + 10);
        local_268.data._M_elems._48_8_ = *(undefined8 *)((local_320->m_backend).data._M_elems + 0xc)
        ;
        local_268.data._M_elems._56_8_ = *(undefined8 *)((local_320->m_backend).data._M_elems + 0xe)
        ;
        local_268.exp = (local_320->m_backend).exp;
        local_268.neg = (local_320->m_backend).neg;
        local_268.fpclass = (local_320->m_backend).fpclass;
        local_268.prec_elem = (local_320->m_backend).prec_elem;
        local_398.fpclass = fVar3;
        local_398.neg = bVar2;
        if ((bVar2 == true) && (local_398.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          local_398.neg = false;
        }
        if ((local_268.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (local_340 = local_398.prec_elem, local_33c = local_398.exp,
           iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_398,&local_268), iVar8 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[lVar15].m_backend,0);
        }
        else {
          *local_328 = iVar9;
          iVar9 = piVar4[lVar15];
          uVar11 = uVar16;
          if (0 < (int)uVar16) {
            do {
              uVar10 = uVar11 - 1;
              uVar14 = uVar10 >> 1;
              if (iVar9 <= ridx[uVar14]) break;
              ridx[uVar11] = ridx[uVar14];
              uVar11 = uVar14;
            } while (1 < uVar10);
          }
          local_328 = local_328 + 1;
          uVar16 = uVar16 + 1;
          ridx[(int)uVar11] = iVar9;
          puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x30 + lVar17);
          *(undefined8 *)puVar1 = result.m_backend.data._M_elems._48_8_;
          *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._56_8_;
          puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x20 + lVar17);
          *(undefined8 *)puVar1 = result.m_backend.data._M_elems._32_8_;
          *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._40_8_;
          puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x10 + lVar17);
          *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._24_8_;
          *(undefined8 *)(eps2.m_backend.data._M_elems._32_8_ + lVar17) =
               result.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._32_8_ + lVar17) + 2) =
               result.m_backend.data._M_elems._8_8_;
          *(int *)(eps2.m_backend.data._M_elems._32_8_ + 0x40 + lVar17) = local_33c;
          *(bool *)(eps2.m_backend.data._M_elems._32_8_ + 0x44 + lVar17) = bVar2;
          *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x48 + lVar17) = fVar3;
          *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x4c + lVar17) = local_340;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < rn);
    }
    *(uint *)eps2.m_backend.data._M_elems._40_8_ = uVar16;
  }
  rn = uVar16;
  uVar5 = eps2.m_backend.data._M_elems._0_8_;
  if ((double)local_330->thedim * 0.2 < (double)(int)eps2.m_backend.data._M_elems[6]) {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = local_330->thedim + -1;
    uVar16 = eps2.m_backend.data._M_elems[6];
  }
  else {
    local_398.fpclass = cpp_dec_float_finite;
    local_398.prec_elem = 0x10;
    local_398.data._M_elems[0] = 0;
    local_398.data._M_elems[1] = 0;
    local_398.data._M_elems[2] = 0;
    local_398.data._M_elems[3] = 0;
    local_398.data._M_elems[4] = 0;
    local_398.data._M_elems[5] = 0;
    local_398.data._M_elems[6] = 0;
    local_398.data._M_elems[7] = 0;
    local_398.data._M_elems[8] = 0;
    local_398.data._M_elems[9] = 0;
    local_398.data._M_elems[10] = 0;
    local_398.data._M_elems[0xb] = 0;
    local_398.data._M_elems[0xc] = 0;
    local_398.data._M_elems[0xd] = 0;
    local_398.data._M_elems._56_5_ = 0;
    local_398.data._M_elems[0xf]._1_3_ = 0;
    local_398.exp = 0;
    local_398.neg = false;
    if ((int)eps2.m_backend.data._M_elems[6] < 1) {
      uVar16 = 0;
    }
    else {
      piVar4 = (local_330->row).perm;
      lVar13 = 0;
      uVar12 = 0;
      do {
        uVar16 = (uint)uVar12;
        lVar15 = (long)*(int *)(eps2.m_backend.data._M_elems._16_8_ + lVar13 * 4);
        lVar17 = lVar15 * 0x50;
        local_398.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + lVar17)
        ;
        local_398.data._M_elems._8_8_ =
             *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._8_8_ + lVar17) + 2);
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar17);
        local_398.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_398.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar17);
        local_398.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_398.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar17);
        local_398.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        local_398.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_398.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_398.exp = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x40 + lVar17);
        local_398.neg = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x44 + lVar17);
        local_398._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x48 + lVar17);
        result.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])(uVar5 + 0x10);
        result.m_backend.data._M_elems._32_16_ = *(undefined1 (*) [16])(uVar5 + 0x20);
        result.m_backend.data._M_elems._48_16_ = *(undefined1 (*) [16])(uVar5 + 0x30);
        result.m_backend.exp = *(int *)(uVar5 + 0x40);
        result.m_backend.neg = *(bool *)(uVar5 + 0x44);
        result.m_backend._72_8_ = *(undefined8 *)(uVar5 + 0x48);
        result.m_backend.data._M_elems[0] = (uint)*(undefined8 *)uVar5;
        if (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])uVar5;
        uVar11 = uVar16;
        if ((result.m_backend.fpclass == cpp_dec_float_NaN || local_398.fpclass == cpp_dec_float_NaN
            ) || (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_398,&result.m_backend), -1 < iVar9)) {
          if (((local_398.fpclass != cpp_dec_float_NaN) && (*(int *)(uVar5 + 0x48) != 2)) &&
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_398,(cpp_dec_float<100U,_int,_void> *)uVar5), 0 < iVar9)) {
            iVar9 = piVar4[lVar15];
            if (0 < (int)uVar16) {
              do {
                uVar14 = (uint)uVar12 - 1;
                uVar10 = uVar14 >> 1;
                iVar8 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar10 * 4);
                uVar11 = (uint)uVar12;
                if (iVar9 <= iVar8) break;
                *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar8;
                uVar12 = (ulong)uVar10;
                uVar11 = uVar10;
              } while (1 < uVar14);
            }
            goto LAB_003f2ee8;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)(lVar17 + eps2.m_backend.data._M_elems._8_8_)
                     ,0);
        }
        else {
          iVar9 = piVar4[lVar15];
          if (0 < (int)uVar16) {
            do {
              uVar14 = (uint)uVar12 - 1;
              uVar10 = uVar14 >> 1;
              iVar8 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar10 * 4);
              uVar11 = (uint)uVar12;
              if (iVar9 <= iVar8) break;
              *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar8;
              uVar12 = (ulong)uVar10;
              uVar11 = uVar10;
            } while (1 < uVar14);
          }
LAB_003f2ee8:
          uVar12 = (ulong)(uVar16 + 1);
          *(int *)(eps2.m_backend.data._M_elems._16_8_ + (long)(int)uVar11 * 4) = iVar9;
        }
        lVar13 = lVar13 + 1;
        uVar16 = (uint)uVar12;
      } while (lVar13 < (int)eps2.m_backend.data._M_elems[6]);
    }
  }
  eps2.m_backend.data._M_elems[6] = uVar16;
  pnVar7 = local_320;
  this_00 = local_330;
  vec_01 = local_338;
  uVar6 = eps2.m_backend.data._M_elems._16_8_;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_320->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((local_320->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_320->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_320->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_320->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)((local_320->m_backend).data._M_elems + 10);
  local_128.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)((local_320->m_backend).data._M_elems + 0xc);
  local_128.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)((local_320->m_backend).data._M_elems + 0xe);
  local_128.m_backend.exp = (local_320->m_backend).exp;
  local_128.m_backend.neg = (local_320->m_backend).neg;
  local_128.m_backend.fpclass = (local_320->m_backend).fpclass;
  local_128.m_backend.prec_elem = (local_320->m_backend).prec_elem;
  rn = vSolveUright(local_330,local_338,local_348,rhs,ridx,rn,&local_128);
  vec_00 = vec2;
  local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar5;
  local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar5 + 8);
  local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar5 + 0x10);
  local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar5 + 0x18);
  local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
  local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)(uVar5 + 0x28);
  local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)(uVar5 + 0x30);
  local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)(uVar5 + 0x38);
  local_178.m_backend.exp = *(int *)(uVar5 + 0x40);
  local_178.m_backend.neg = *(bool *)(uVar5 + 0x44);
  local_178.m_backend._72_8_ = *(undefined8 *)(uVar5 + 0x48);
  vSolveUrightNoNZ(this_00,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)uVar6,
                   eps2.m_backend.data._M_elems[6],&local_178);
  if ((this_00->l).updateType == 0) {
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar7->m_backend).data._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar7->m_backend).data._M_elems + 2)
    ;
    local_1c8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 8);
    local_1c8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 10);
    local_1c8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 0xc);
    local_1c8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 0xe);
    local_1c8.m_backend.exp = (pnVar7->m_backend).exp;
    local_1c8.m_backend.neg = (pnVar7->m_backend).neg;
    local_1c8.m_backend.fpclass = (pnVar7->m_backend).fpclass;
    local_1c8.m_backend.prec_elem = (pnVar7->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_01,local_348,rn,&local_1c8);
    local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar5;
    local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar5 + 8);
    local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar5 + 0x10);
    local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar5 + 0x18);
    local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
    local_218.m_backend.data._M_elems._40_8_ = *(undefined8 *)(uVar5 + 0x28);
    local_218.m_backend.data._M_elems._48_8_ = *(undefined8 *)(uVar5 + 0x30);
    local_218.m_backend.data._M_elems._56_8_ = *(undefined8 *)(uVar5 + 0x38);
    local_218.m_backend.exp = *(int *)(uVar5 + 0x40);
    local_218.m_backend.neg = *(bool *)(uVar5 + 0x44);
    local_218.m_backend._72_8_ = *(undefined8 *)(uVar5 + 0x48);
    vSolveUpdateRightNoNZ(this_00,vec_00,&local_218);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}